

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

bool __thiscall
pybind11::detail::
map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>
::load(map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>
       *this,handle src,bool convert)

{
  ssize_t *__args;
  handle src_00;
  PyObject *src_01;
  bool bVar1;
  bool bVar2;
  undefined1 local_a0 [8];
  value_conv vconv;
  dict_iterator __begin3;
  key_conv kconv;
  handle local_40;
  dict d;
  
  if ((src.m_ptr == (PyObject *)0x0) || (((src.m_ptr)->ob_type->tp_flags & 0x20000000) == 0)) {
    bVar2 = false;
  }
  else {
    (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
    local_40.m_ptr = src.m_ptr;
    d.super_object.super_handle.m_ptr = (object)(object)this;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
             *)this);
    dict::begin((dict_iterator *)
                &vconv.super_type_caster_base<kratos::Var>.super_type_caster_generic.value,
                (dict *)&local_40);
    __args = &__begin3.super_dict_readonly.pos;
    while (src_01 = __begin3.super_dict_readonly.key,
          src_00.m_ptr = __begin3.super_dict_readonly.obj.m_ptr,
          bVar2 = __begin3.super_dict_readonly.value == (PyObject *)0xffffffffffffffff, !bVar2) {
      __begin3.super_dict_readonly.pos =
           (ssize_t)&kconv.
                     super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     .value._M_string_length;
      kconv.
      super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      .value._M_dataplus._M_p = (pointer)0x0;
      kconv.
      super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      .value._M_string_length._0_1_ = 0;
      type_caster_base<kratos::Var>::type_caster_base((type_caster_base<kratos::Var> *)local_a0);
      bVar1 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      *)__args,src_00,convert);
      if (!bVar1) {
LAB_0037fe6c:
        std::__cxx11::string::~string((string *)&__begin3.super_dict_readonly.pos);
        break;
      }
      bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                        ((type_caster_generic *)local_a0,(handle)src_01,convert);
      if (!bVar1) goto LAB_0037fe6c;
      kconv.
      super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      .value.field_2._8_8_ =
           vconv.super_type_caster_base<kratos::Var>.super_type_caster_generic.cpptype;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>>
      ::_M_emplace_unique<std::__cxx11::string,kratos::Var*>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>>
                  *)d.super_object.super_handle.m_ptr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args,
                 (Var **)((long)&kconv.
                                 super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                 .value.field_2 + 8));
      std::__cxx11::string::~string((string *)__args);
      iterator_policies::dict_readonly::increment
                ((dict_readonly *)
                 &vconv.super_type_caster_base<kratos::Var>.super_type_caster_generic.value);
    }
    object::~object((object *)&local_40);
  }
  return bVar2;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<dict>(src))
            return false;
        auto d = reinterpret_borrow<dict>(src);
        value.clear();
        for (auto it : d) {
            key_conv kconv;
            value_conv vconv;
            if (!kconv.load(it.first.ptr(), convert) ||
                !vconv.load(it.second.ptr(), convert))
                return false;
            value.emplace(cast_op<Key &&>(std::move(kconv)), cast_op<Value &&>(std::move(vconv)));
        }
        return true;
    }